

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O3

unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *this,string *name,bool param_2
          ,cmake *cm)

{
  size_t __n;
  int iVar1;
  size_t *__s2;
  cmGlobalGhsMultiGenerator *this_00;
  undefined7 in_register_00000011;
  cmake *in_R8;
  bool bVar2;
  size_type __dnew;
  size_t *local_58;
  size_t local_50;
  size_t local_48 [2];
  size_t local_38;
  
  local_38 = 0x11;
  local_58 = local_48;
  __s2 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_48[0] = local_38;
  *__s2 = 0x6948206e65657247;
  __s2[1] = 0x544c554d20736c6c;
  *(char *)(__s2 + 2) = 'I';
  local_50 = local_38;
  *(char *)((long)__s2 + local_38) = '\0';
  __n = ((undefined8 *)CONCAT71(in_register_00000011,param_2))[1];
  local_58 = __s2;
  if (__n == local_38) {
    if (__n == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = bcmp(*(void **)CONCAT71(in_register_00000011,param_2),__s2,__n);
      bVar2 = iVar1 != 0;
    }
  }
  else {
    bVar2 = true;
  }
  if (__s2 != local_48) {
    operator_delete(__s2,local_48[0] + 1);
  }
  if (bVar2) {
    this_00 = (cmGlobalGhsMultiGenerator *)0x0;
  }
  else {
    this_00 = (cmGlobalGhsMultiGenerator *)operator_new(0x728);
    cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(this_00,in_R8);
  }
  (this->super_cmGlobalGeneratorFactory)._vptr_cmGlobalGeneratorFactory = (_func_int **)this_00;
  return (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmGlobalGenerator> CreateGlobalGenerator(
    const std::string& name, bool /*allowArch*/, cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return std::unique_ptr<cmGlobalGenerator>();
    }
    return std::unique_ptr<cmGlobalGenerator>(cm::make_unique<T>(cm));
  }